

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_checkingOwningModelWithUnitBaseOnlyInModel_Test::TestBody
          (Units_checkingOwningModelWithUnitBaseOnlyInModel_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  allocator<char> local_ba;
  allocator<char> local_b9;
  AssertionResult gtest_ar;
  allocator<char> local_91;
  double local_90 [4];
  double local_70 [4];
  UnitsPtr u1;
  UnitsPtr u2;
  ModelPtr model;
  UnitsPtr u;
  
  libcellml::Model::create();
  libcellml::Units::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"apple",(allocator<char> *)local_90);
  libcellml::NamedEntity::setName
            ((string *)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Units::create();
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u1",(allocator<char> *)local_90);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"apple",(allocator<char> *)&u2);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"kilo",&local_b9);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"",&local_ba);
  libcellml::Units::addUnit((string *)peVar1,(string *)&gtest_ar,2.0,0.001,(string *)local_90);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"dimensionless",(allocator<char> *)local_90);
  libcellml::Units::addUnit
            ((string *)u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Units::create();
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"u2",(allocator<char> *)local_90);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"apple",&local_b9);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"kilo",&local_ba);
  pcVar2 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"",&local_91);
  libcellml::Units::addUnit
            ((string *)u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&gtest_ar,4.0,0.001,(string *)local_90);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&gtest_ar);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_90[0] = 0.0;
  local_70[0] = (double)libcellml::Units::scalingFactor((shared_ptr *)&u1,(shared_ptr *)&u2,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0","libcellml::Units::scalingFactor(u1, u2)",local_90,local_70
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_90);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x550,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_90[0] = 0.0;
  local_70[0] = (double)libcellml::Units::scalingFactor((shared_ptr *)&u2,(shared_ptr *)&u1,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"0.0","libcellml::Units::scalingFactor(u2, u1)",local_90,local_70
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x551,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, checkingOwningModelWithUnitBaseOnlyInModel)
{
    libcellml::ModelPtr model = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("apple");

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("apple", "kilo", 2.0, 0.001); // standard, exponent.
    u1->addUnit("dimensionless");

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("apple", "kilo", 4.0, 0.001); // standard, exponent.

    model->addUnits(u);
    model->addUnits(u1);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}